

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QList<QAccessibleInterface_*> * __thiscall
QAccessibleTableCell::columnHeaderCells
          (QList<QAccessibleInterface_*> *__return_storage_ptr__,QAccessibleTableCell *this)

{
  Data *pDVar1;
  undefined4 uVar2;
  QHeaderView *pQVar3;
  QAccessibleInterface *pQVar4;
  undefined8 uVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QAccessibleInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAccessibleInterface **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar3 = horizontalHeader(this);
  if (pQVar3 != (QHeaderView *)0x0) {
    pQVar4 = (QAccessibleInterface *)operator_new(0x20);
    pDVar1 = (this->view).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar6 = (QObject *)0x0;
    }
    else {
      pQVar6 = (this->view).wp.value;
    }
    uVar2 = QPersistentModelIndex::column();
    *(undefined ***)pQVar4 = &PTR__QAccessibleTableHeaderCell_00818630;
    if (pQVar6 == (QObject *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar6);
    }
    *(undefined8 *)(pQVar4 + 8) = uVar5;
    *(QObject **)(pQVar4 + 0x10) = pQVar6;
    *(undefined4 *)(pQVar4 + 0x18) = uVar2;
    *(undefined4 *)(pQVar4 + 0x1c) = 1;
    local_38 = pQVar4;
    QtPrivate::QPodArrayOps<QAccessibleInterface*>::emplace<QAccessibleInterface*&>
              ((QPodArrayOps<QAccessibleInterface*> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_38);
    QList<QAccessibleInterface_*>::end(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAccessibleInterface*> QAccessibleTableCell::columnHeaderCells() const
{
    QList<QAccessibleInterface*> headerCell;
    if (horizontalHeader()) {
        // FIXME
        headerCell.append(new QAccessibleTableHeaderCell(view, m_index.column(), Qt::Horizontal));
    }
    return headerCell;
}